

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O2

string * ApprovalTests::getOsPrefix_abi_cxx11_(void)

{
  bool bVar1;
  allocator *paVar2;
  char *pcVar3;
  string *in_RDI;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  bVar1 = SystemUtils::isMacOs();
  if (bVar1) {
    pcVar3 = "Mac::";
    paVar2 = &local_9;
  }
  else {
    bVar1 = SystemUtils::isWindowsOs();
    if (bVar1) {
      pcVar3 = "Windows::";
      paVar2 = &local_a;
    }
    else {
      pcVar3 = "Linux::";
      paVar2 = &local_b;
    }
  }
  ::std::__cxx11::string::string((string *)in_RDI,pcVar3,paVar2);
  return in_RDI;
}

Assistant:

std::string getOsPrefix()
    {
        if (SystemUtils::isMacOs())
        {
            return "Mac::";
        }

        if (SystemUtils::isWindowsOs())
        {
            return "Windows::";
        }

        return "Linux::";
    }